

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Minisat::SimpSolver::eliminate(SimpSolver *this,bool turn_off_elim)

{
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  char *__ptr;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  
  (this->super_Solver).systematic_branching_state = 1;
  bVar7 = true;
  if ((this->super_Solver).vardata.sz != 0) {
    if ((this->super_Solver).trail.sz != 0) {
      removeSatisfied(this);
    }
    iVar2 = (this->super_Solver).clauses.sz;
    bVar6 = eliminate_(this);
    if (bVar6) {
      piVar5 = &(this->super_Solver).trail.sz;
      piVar8 = piVar5;
      if ((this->super_Solver).trail_lim.sz != 0) {
        piVar8 = (this->super_Solver).trail_lim.data;
      }
      uVar13 = (this->super_Solver).clauses.sz;
      uVar12 = (int)(this->super_Solver).dec_vars - *piVar8;
      if (0 < (this->super_Solver).verbosity) {
        printf("c Reduced to %d vars, %d cls (grow=%d)\n",(ulong)uVar12,(ulong)uVar13,
               (ulong)(uint)this->grow);
      }
      if (((int)uVar12 < 10000) || (10.0 <= (double)(int)uVar13 / (double)(int)uVar12)) {
        if (0 < (this->super_Solver).verbosity) {
          bVar7 = true;
          printf("c No iterative elimination performed. (vars=%d, c/v ratio=%.1f)\n",(ulong)uVar12);
        }
      }
      else {
        iVar9 = 8;
        if (this->grow != 0) {
          iVar9 = this->grow * 2;
        }
        this->grow = iVar9;
        if (iVar9 < 10000) {
          uVar10 = 0;
          while( true ) {
            iVar9 = (this->super_Solver).clauses.sz;
            if (0 < iVar9) {
              lVar11 = 0;
              do {
                uVar13 = (this->super_Solver).clauses.data[lVar11];
                puVar4 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
                if (*(ulong *)(puVar4 + uVar13) >> 0x22 != 0) {
                  puVar1 = (ulong *)(puVar4 + uVar13);
                  uVar14 = 0;
                  do {
                    iVar9 = *(int *)((long)puVar1 + uVar14 * 4 + 8) >> 1;
                    if ((iVar9 < (this->elim_heap).indices.sz) &&
                       (-1 < (this->elim_heap).indices.data[iVar9])) {
                      Heap<Minisat::SimpSolver::ElimLt>::update(&this->elim_heap,iVar9);
                    }
                    else {
                      Heap<Minisat::SimpSolver::ElimLt>::insert(&this->elim_heap,iVar9);
                    }
                    uVar14 = uVar14 + 1;
                  } while (uVar14 < *puVar1 >> 0x22);
                  iVar9 = (this->super_Solver).clauses.sz;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < iVar9);
            }
            piVar8 = piVar5;
            if ((this->super_Solver).trail_lim.sz != 0) {
              piVar8 = (this->super_Solver).trail_lim.data;
            }
            uVar13 = (int)(this->super_Solver).dec_vars - *piVar8;
            bVar7 = eliminate_(this);
            if (!bVar7) break;
            piVar8 = piVar5;
            if ((this->super_Solver).trail_lim.sz != 0) {
              piVar8 = (this->super_Solver).trail_lim.data;
            }
            uVar12 = (int)(this->super_Solver).dec_vars - *piVar8;
            if (uVar13 == uVar12) break;
            uVar3 = (this->super_Solver).clauses.sz;
            dVar15 = (double)(int)uVar13 / (double)(int)uVar12;
            if (0 < (this->super_Solver).verbosity) {
              printf("c Reduced to %d vars, %d cls (grow=%d)\n",(ulong)uVar12,(ulong)uVar3,
                     (ulong)(uint)this->grow);
              printf("c cl_inc_rate=%.3f, var_dec_rate=%.3f\n",(double)(int)uVar3 / (double)iVar9,
                     dVar15);
            }
            uVar10 = (ulong)((int)uVar10 + 1);
            if (((iVar2 < (int)uVar3) || (dVar15 < (double)(int)uVar3 / (double)iVar9)) ||
               (iVar9 = this->grow, this->grow = iVar9 * 2, 4999 < iVar9)) break;
          }
        }
        else {
          bVar7 = true;
          uVar10 = 0;
        }
        if (0 < (this->super_Solver).verbosity) {
          printf("c No. effective iterative eliminations: %d\n",uVar10);
        }
      }
    }
    else {
      bVar7 = false;
    }
  }
  __ptr = (this->touched).data;
  if (__ptr != (char *)0x0) {
    (this->touched).sz = 0;
    free(__ptr);
    (this->touched).data = (char *)0x0;
    (this->touched).cap = 0;
  }
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clear
            (&this->occurs,true);
  piVar5 = (this->n_occ).data;
  if (piVar5 != (int *)0x0) {
    (this->n_occ).sz = 0;
    free(piVar5);
    (this->n_occ).data = (int *)0x0;
    (this->n_occ).cap = 0;
  }
  Heap<Minisat::SimpSolver::ElimLt>::clear(&this->elim_heap,true);
  Queue<unsigned_int>::clear(&this->subsumption_queue,true);
  this->use_simplification = false;
  (this->super_Solver).remove_satisfied = true;
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = 0;
  Solver::rebuildOrderHeap(&this->super_Solver);
  (*(this->super_Solver)._vptr_Solver[2])(this);
  (this->super_Solver).systematic_branching_state = 0;
  return bVar7;
}

Assistant:

bool SimpSolver::eliminate(bool turn_off_elim)
{
    bool res = true;
    int iter = 0;
    int n_cls, n_cls_init, n_vars;

    systematic_branching_state = 1;

    if (nVars() == 0) goto cleanup; // User disabling preprocessing.

    // Get an initial number of clauses (more accurately).
    if (trail.size() != 0) removeSatisfied();
    n_cls_init = nClauses();

    res = eliminate_(); // The first, usual variable elimination of MiniSat.
    if (!res) goto cleanup;

    n_cls = nClauses();
    n_vars = nFreeVars();

    if (verbosity >= 1) printf("c Reduced to %d vars, %d cls (grow=%d)\n", n_vars, n_cls, grow);

    if ((double)n_cls / n_vars >= 10 || n_vars < 10000) {
        if (verbosity > 0)
            printf("c No iterative elimination performed. (vars=%d, c/v ratio=%.1f)\n", n_vars, (double)n_cls / n_vars);
        goto cleanup;
    }

    grow = grow ? grow * 2 : 8;
    for (; grow < 10000; grow *= 2) {
        // Rebuild elimination variable heap.
        for (int i = 0; i < clauses.size(); i++) {
            const Clause &c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (!elim_heap.inHeap(var(c[j])))
                    elim_heap.insert(var(c[j]));
                else
                    elim_heap.update(var(c[j]));
        }

        int n_cls_last = nClauses();
        int n_vars_last = nFreeVars();

        res = eliminate_();
        if (!res || n_vars_last == nFreeVars()) break;
        iter++;

        int n_cls_now = nClauses();
        int n_vars_now = nFreeVars();

        double cl_inc_rate = (double)n_cls_now / n_cls_last;
        double var_dec_rate = (double)n_vars_last / n_vars_now;

        if (verbosity >= 1) {
            printf("c Reduced to %d vars, %d cls (grow=%d)\n", n_vars_now, n_cls_now, grow);
            printf("c cl_inc_rate=%.3f, var_dec_rate=%.3f\n", cl_inc_rate, var_dec_rate);
        }

        if (n_cls_now > n_cls_init || cl_inc_rate > var_dec_rate) break;
    }
    if (verbosity >= 1) printf("c No. effective iterative eliminations: %d\n", iter);

cleanup:
    touched.clear(true);
    occurs.clear(true);
    n_occ.clear(true);
    elim_heap.clear(true);
    subsumption_queue.clear(true);

    use_simplification = false;
    remove_satisfied = true;
    ca.extra_clause_field = false;

    // Force full cleanup (this is safe and desirable since it only happens once):
    rebuildOrderHeap();
    garbageCollect();

    systematic_branching_state = 0;
    return res;
}